

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall mjs::parser::parse_statement(parser *this,bool check_for_strict_mode)

{
  bool bVar1;
  bool bVar2;
  token_type tVar3;
  int iVar4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1;
  __tuple_element_t<1UL,_tuple<source_extend,_vector<basic_string<wchar_t>,_allocator<basic_string<wchar_t>_>_>,_unique_ptr<statement,_default_delete<statement>_>_>_>
  *args_3;
  __tuple_element_t<2UL,_tuple<source_extend,_vector<basic_string<wchar_t>,_allocator<basic_string<wchar_t>_>_>,_unique_ptr<statement,_default_delete<statement>_>_>_>
  *this_00;
  block_statement *this_01;
  pointer psVar5;
  variable_statement *this_02;
  list *this_03;
  size_type sVar6;
  token *this_04;
  wostream *pwVar7;
  pointer peVar8;
  identifier_expression *this_05;
  wstring *pwVar9;
  type e_00;
  char *pcVar10;
  byte in_DL;
  undefined7 in_register_00000031;
  parser *parent;
  wchar_t *in_R9;
  undefined1 auVar11 [16];
  wstring_view message;
  wstring_view message_00;
  wstring_view wVar12;
  bool local_f7b;
  undefined1 local_ea8 [16];
  undefined1 local_e98 [40];
  undefined1 local_e70 [8];
  expression_ptr e_5;
  undefined1 local_e60 [40];
  undefined1 local_e38 [8];
  undefined1 local_e30 [40];
  undefined1 local_e08 [48];
  token local_dd8;
  wstring local_db0 [32];
  undefined1 local_d90 [16];
  source_extend local_d80;
  mjs local_d68 [16];
  wstring local_d58;
  wostringstream local_d38 [8];
  wostringstream _oss_1;
  wstring local_bb0 [8];
  wstring n;
  undefined1 local_b68 [40];
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> local_b40;
  wstring catch_id;
  statement_ptr finally_;
  statement_ptr catch_;
  statement_ptr block_1;
  undefined1 local_ae0 [8];
  expression_ptr e_4;
  undefined1 local_a90 [16];
  undefined1 local_a80 [4];
  token_type tt;
  statement_list sl;
  undefined1 local_a40 [48];
  undefined1 local_a10 [40];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_9e8;
  expression_ptr e_3;
  undefined1 local_9b0 [7];
  bool has_default;
  clause_list cl;
  token local_970;
  undefined1 local_948 [8];
  expression_ptr switch_e;
  undefined1 local_918 [40];
  undefined1 local_8f0 [48];
  undefined1 local_8c0 [8];
  expression_ptr e_2;
  token local_890;
  wstring local_868 [32];
  undefined1 local_848 [16];
  source_extend local_838;
  wostringstream local_820 [8];
  wostringstream _oss;
  undefined1 local_6a8 [8];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_6a0;
  expression_ptr e_1;
  undefined1 local_670 [8];
  wstring id_2;
  undefined1 local_628 [8];
  wstring id_1;
  undefined1 local_5e0 [48];
  undefined1 local_5b0 [8];
  undefined1 local_5a8 [80];
  undefined1 local_558 [8];
  undefined1 local_550 [80];
  undefined1 local_500 [48];
  undefined1 local_4d0 [8];
  expression_ptr e;
  undefined1 local_4a0 [16];
  list local_490;
  undefined1 local_478 [8];
  undefined1 local_470 [40];
  undefined1 local_448 [80];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_3f8;
  expression_ptr iter;
  expression_ptr cond_3;
  statement_ptr init;
  undefined1 local_3b8 [48];
  undefined1 local_388 [8];
  expression_ptr cond_2;
  undefined1 local_358 [80];
  undefined1 local_308 [8];
  expression_ptr cond_1;
  token local_2d8;
  undefined1 local_2b0 [8];
  statement_ptr s;
  undefined1 local_280 [40];
  undefined1 local_258 [8];
  statement_ptr else_s;
  undefined1 local_228 [8];
  statement_ptr if_s;
  undefined1 local_1f8 [8];
  expression_ptr cond;
  undefined1 local_1c8 [80];
  undefined1 local_178 [8];
  list dl;
  type *block;
  type *params;
  type *extend;
  token local_d8;
  undefined1 local_b0 [8];
  wstring id;
  source_extend id_extend;
  undefined1 local_40 [8];
  position_stack_node _statement_position__LINE__;
  bool check_for_strict_mode_local;
  parser *this_local;
  statement_ptr *s_1;
  
  parent = (parser *)CONCAT71(in_register_00000031,check_for_strict_mode);
  _statement_position__LINE__._31_1_ = in_DL & 1;
  pcVar10 = (char *)this;
  position_stack_node::position_stack_node
            ((position_stack_node *)local_40,parent,&parent->statement_pos_);
  tVar3 = current_token_type(parent);
  if (tVar3 == lbrace) {
    parse_block(this,check_for_strict_mode);
    goto LAB_001e0242;
  }
  iVar4 = (int)parent;
  accept((parser *)&id_extend.start,iVar4,(sockaddr *)0x4d,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool((token *)&id_extend.start);
  token::~token((token *)&id_extend.start);
  if (bVar1) {
    current_extend((source_extend *)((long)&id.field_2 + 8),parent);
    expect(&local_d8,parent,identifier,"parse_statement",0x350);
    pwVar9 = token::text_abi_cxx11_(&local_d8);
    std::__cxx11::wstring::wstring((wstring *)local_b0,(wstring *)pwVar9);
    token::~token(&local_d8);
    parse_function_abi_cxx11_
              ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                *)&extend,parent);
    args_1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             std::
             get<0ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                       ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                         *)&extend);
    args_3 = std::
             get<1ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                       ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                         *)&extend);
    this_00 = std::
              get<2ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                        ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                          *)&extend);
    psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       (this_00);
    iVar4 = (*(psVar5->super_syntax_node)._vptr_syntax_node[3])();
    if (iVar4 != 0) {
      __assert_fail("block->type() == statement_type::block",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                    ,0x352,"statement_ptr mjs::parser::parse_statement(bool)");
    }
    this_01 = (block_statement *)
              std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                        (this_00);
    bVar1 = block_statement::strict_mode(this_01);
    if (bVar1) {
      wVar12 = (wstring_view)
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_b0);
      check_function_name(parent,wVar12,(source_extend *)((long)&id.field_2 + 8));
    }
    make_statement<mjs::function_definition,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(source_extend *)parent,args_1,
               (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_b0,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)args_3);
    std::
    tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
    ::~tuple((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
              *)&extend);
    std::__cxx11::wstring::~wstring((wstring *)local_b0);
    source_extend::~source_extend((source_extend *)((long)&id.field_2 + 8));
    goto LAB_001e0242;
  }
  accept((parser *)
         &dl.super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,iVar4,(sockaddr *)0x6c,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool
                    ((token *)&dl.
                               super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  token::~token((token *)&dl.super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    parse_variable_declaration_list((list *)local_178,parent);
    expect_semicolon_allow_insertion(parent,"parse_statement",0x359);
    make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
              (this,(vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)parent);
    std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::~vector
              ((vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)local_178);
    goto LAB_001e0242;
  }
  tVar3 = current_token_type(parent);
  if (tVar3 == semicolon) {
    get_token((token *)(local_1c8 + 0x28),parent);
    token::~token((token *)(local_1c8 + 0x28));
    make_statement<mjs::empty_statement>(this);
    goto LAB_001e0242;
  }
  accept((parser *)local_1c8,iVar4,(sockaddr *)0x4f,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool((token *)local_1c8);
  token::~token((token *)local_1c8);
  if (bVar1) {
    expect((token *)&cond,parent,lparen,"parse_statement",0x35f);
    token::~token((token *)&cond);
    parse_expression((parser *)local_1f8);
    pcVar10 = "parse_statement";
    expect((token *)&if_s,parent,rparen,"parse_statement",0x361);
    token::~token((token *)&if_s);
    parse_statement((parser *)local_228,check_for_strict_mode);
    accept((parser *)&else_s,iVar4,(sockaddr *)0x34,(socklen_t *)pcVar10);
    token::~token((token *)&else_s);
    accept((parser *)local_280,iVar4,(sockaddr *)0x44,(socklen_t *)pcVar10);
    bVar1 = token::operator_cast_to_bool((token *)local_280);
    if (bVar1) {
      parse_statement((parser *)local_258,check_for_strict_mode);
    }
    else {
      std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
      unique_ptr<std::default_delete<mjs::statement>,void>
                ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)local_258);
    }
    token::~token((token *)local_280);
    make_statement<mjs::if_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)parent,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_1f8,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_228);
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_258);
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_228);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1f8);
    goto LAB_001e0242;
  }
  accept((parser *)&s,iVar4,(sockaddr *)0x42,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool((token *)&s);
  token::~token((token *)&s);
  if (bVar1) {
    parse_statement((parser *)local_2b0,check_for_strict_mode);
    expect(&local_2d8,parent,while_,"parse_statement",0x368);
    token::~token(&local_2d8);
    expect((token *)&cond_1,parent,lparen,"parse_statement",0x369);
    token::~token((token *)&cond_1);
    parse_expression((parser *)local_308);
    expect((token *)(local_358 + 0x28),parent,rparen,"parse_statement",0x36b);
    token::~token((token *)(local_358 + 0x28));
    expect_semicolon_allow_insertion(parent,"parse_statement",0x36c);
    make_statement<mjs::do_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)parent,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_308);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_308);
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_2b0);
    goto LAB_001e0242;
  }
  accept((parser *)local_358,iVar4,(sockaddr *)0x6f,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool((token *)local_358);
  token::~token((token *)local_358);
  if (bVar1) {
    expect((token *)&cond_2,parent,lparen,"parse_statement",0x36f);
    token::~token((token *)&cond_2);
    parse_expression((parser *)local_388);
    expect((token *)(local_3b8 + 8),parent,rparen,"parse_statement",0x371);
    token::~token((token *)(local_3b8 + 8));
    parse_statement((parser *)local_3b8,check_for_strict_mode);
    make_statement<mjs::while_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)parent,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_388);
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_3b8);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_388);
    goto LAB_001e0242;
  }
  accept((parser *)&init,iVar4,(sockaddr *)0x4c,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool((token *)&init);
  token::~token((token *)&init);
  if (!bVar1) {
    accept((parser *)((long)&id_1.field_2 + 8),iVar4,(sockaddr *)0x3e,(socklen_t *)pcVar10);
    bVar1 = token::operator_cast_to_bool((token *)((long)&id_1.field_2 + 8));
    token::~token((token *)((long)&id_1.field_2 + 8));
    if (bVar1) {
      get_label_abi_cxx11_((wstring *)local_628,parent);
      expect_semicolon_allow_insertion(parent,"parse_statement",0x397);
      make_statement<mjs::continue_statement,std::__cxx11::wstring>
                (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      parent);
      std::__cxx11::wstring::~wstring((wstring *)local_628);
    }
    else {
      accept((parser *)((long)&id_2.field_2 + 8),iVar4,(sockaddr *)0x37,(socklen_t *)pcVar10);
      bVar1 = token::operator_cast_to_bool((token *)((long)&id_2.field_2 + 8));
      token::~token((token *)((long)&id_2.field_2 + 8));
      if (bVar1) {
        get_label_abi_cxx11_((wstring *)local_670,parent);
        expect_semicolon_allow_insertion(parent,"parse_statement",0x39b);
        make_statement<mjs::break_statement,std::__cxx11::wstring>
                  (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *)parent);
        std::__cxx11::wstring::~wstring((wstring *)local_670);
      }
      else {
        accept((parser *)&e_1,iVar4,(sockaddr *)0x5f,(socklen_t *)pcVar10);
        bVar1 = token::operator_cast_to_bool((token *)&e_1);
        token::~token((token *)&e_1);
        if (bVar1) {
          std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
          unique_ptr<std::default_delete<mjs::expression>,void>
                    ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)&local_6a0)
          ;
          if (((parent->line_break_skipped_ & 1U) == 0) &&
             (tVar3 = current_token_type(parent), tVar3 != semicolon)) {
            parse_expression((parser *)local_6a8);
            std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                      (&local_6a0,
                       (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                       local_6a8);
            std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                      ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                       local_6a8);
          }
          expect_semicolon_allow_insertion(parent,"parse_statement",0x3a3);
          make_statement<mjs::return_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                    (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                          parent);
          std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                    (&local_6a0);
        }
        else {
          tVar3 = current_token_type(parent);
          if (tVar3 == with_) {
            if ((parent->strict_mode_ & 1U) != 0) {
              std::__cxx11::wostringstream::wostringstream(local_820);
              std::operator<<((wostream *)local_820,
                              "Strict mode code may not include a WithStatement");
              current_extend(&local_838,parent);
              std::__cxx11::wostringstream::str();
              local_848 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_868);
              message._M_str = in_R9;
              message._M_len = local_848._8_8_;
              syntax_error((parser *)"parse_statement",(char *)0x3a7,(int)&local_838,local_848._0_8_
                           ,message);
            }
            get_token(&local_890,parent);
            token::~token(&local_890);
            expect((token *)&e_2,parent,lparen,"parse_statement",0x3aa);
            token::~token((token *)&e_2);
            parse_expression((parser *)local_8c0);
            expect((token *)(local_8f0 + 8),parent,rparen,"parse_statement",0x3ac);
            token::~token((token *)(local_8f0 + 8));
            parse_statement((parser *)local_8f0,check_for_strict_mode);
            make_statement<mjs::with_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                      (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                            parent,
                       (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_8c0
                      );
            std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                      ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_8f0
                      );
            std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                      ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                       local_8c0);
          }
          else {
            accept((parser *)local_918,iVar4,(sockaddr *)0x63,(socklen_t *)pcVar10);
            bVar1 = token::operator_cast_to_bool((token *)local_918);
            token::~token((token *)local_918);
            if (bVar1) {
              expect((token *)&switch_e,parent,lparen,"parse_statement",0x3af);
              token::~token((token *)&switch_e);
              parse_expression((parser *)local_948);
              expect(&local_970,parent,rparen,"parse_statement",0x3b1);
              token::~token(&local_970);
              pcVar10 = "parse_statement";
              expect((token *)&cl.
                               super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,parent,lbrace,
                     "parse_statement",0x3b2);
              token::~token((token *)&cl.
                                      super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::vector
                        ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)local_9b0);
              bVar1 = false;
              while( true ) {
                accept((parser *)&e_3,iVar4,(sockaddr *)0x31,(socklen_t *)pcVar10);
                bVar2 = token::operator_cast_to_bool((token *)&e_3);
                token::~token((token *)&e_3);
                if (((bVar2 ^ 0xffU) & 1) == 0) break;
                std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
                unique_ptr<std::default_delete<mjs::expression>,void>
                          ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)
                           &local_9e8);
                accept((parser *)local_a10,iVar4,(sockaddr *)0x40,(socklen_t *)pcVar10);
                bVar2 = token::operator_cast_to_bool((token *)local_a10);
                token::~token((token *)local_a10);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  if (bVar1) {
                    unhandled(parent,"parse_statement",0x3be);
                  }
                  bVar1 = true;
                }
                else {
                  expect((token *)(local_a40 + 8),parent,case_,"parse_statement",0x3b9);
                  token::~token((token *)(local_a40 + 8));
                  parse_expression((parser *)local_a40);
                  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                            (&local_9e8,
                             (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                             local_a40);
                  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                  ~unique_ptr((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                              local_a40);
                }
                pcVar10 = "parse_statement";
                expect((token *)&sl.
                                 super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,parent,colon,
                       "parse_statement",0x3c2);
                token::~token((token *)&sl.
                                        super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                ::vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                          *)local_a80);
                while ((((local_a90._12_4_ = current_token_type(parent), local_a90._12_4_ != rbrace
                         && (local_a90._12_4_ != case_)) && (local_a90._12_4_ != default_)) &&
                       (local_a90._12_4_ != eof))) {
                  parse_statement((parser *)local_a90,check_for_strict_mode);
                  std::
                  vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                  ::
                  emplace_back<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                            ((vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>
                              *)local_a80,
                             (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                             local_a90);
                  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                            ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                             local_a90);
                }
                case_clause::case_clause
                          ((case_clause *)&stack0xfffffffffffff550,&local_9e8,
                           (statement_list *)local_a80);
                std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::push_back
                          ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)local_9b0,
                           (value_type *)&stack0xfffffffffffff550);
                case_clause::~case_clause((case_clause *)&stack0xfffffffffffff550);
                std::
                vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                           *)local_a80);
                std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                          (&local_9e8);
              }
              make_statement<mjs::switch_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<mjs::case_clause,std::allocator<mjs::case_clause>>>
                        (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                              parent,
                         (vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)local_948);
              std::vector<mjs::case_clause,_std::allocator<mjs::case_clause>_>::~vector
                        ((vector<mjs::case_clause,_std::allocator<mjs::case_clause>_> *)local_9b0);
              std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                        ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                         local_948);
            }
            else {
              accept((parser *)&e_4,iVar4,(sockaddr *)0x66,(socklen_t *)pcVar10);
              bVar1 = token::operator_cast_to_bool((token *)&e_4);
              token::~token((token *)&e_4);
              if (bVar1) {
                if ((parent->line_break_skipped_ & 1U) != 0) {
                  unhandled(parent,"parse_statement",0x3d5);
                }
                parse_expression((parser *)local_ae0);
                expect_semicolon_allow_insertion(parent,"parse_statement",0x3d8);
                make_statement<mjs::throw_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                          (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                 *)parent);
                std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                          ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                           local_ae0);
              }
              else {
                accept((parser *)&block_1,iVar4,(sockaddr *)0x6a,(socklen_t *)pcVar10);
                bVar1 = token::operator_cast_to_bool((token *)&block_1);
                token::~token((token *)&block_1);
                if (bVar1) {
                  parse_block((parser *)&catch_,check_for_strict_mode);
                  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
                  unique_ptr<std::default_delete<mjs::statement>,void>
                            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)
                             &finally_);
                  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
                  unique_ptr<std::default_delete<mjs::statement>,void>
                            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)
                             ((long)&catch_id.field_2 + 8));
                  std::__cxx11::wstring::wstring((wstring *)&local_b40);
                  accept((parser *)local_b68,iVar4,(sockaddr *)0x3a,(socklen_t *)pcVar10);
                  bVar1 = token::operator_cast_to_bool((token *)local_b68);
                  token::~token((token *)local_b68);
                  if (bVar1) {
                    expect((token *)((long)&n.field_2 + 8),parent,lparen,"parse_statement",0x3df);
                    token::~token((token *)((long)&n.field_2 + 8));
                    if (((parent->strict_mode_ & 1U) != 0) &&
                       (tVar3 = current_token_type(parent), tVar3 == identifier)) {
                      this_04 = current_token(parent);
                      pwVar9 = token::text_abi_cxx11_(this_04);
                      std::__cxx11::wstring::wstring(local_bb0,(wstring *)pwVar9);
                      auVar11 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_bb0)
                      ;
                      wVar12._M_str = auVar11._8_8_;
                      wVar12._M_len = (size_t)wVar12._M_str;
                      bVar1 = is_strict_mode_unassignable_identifier(auVar11._0_8_,wVar12);
                      if (bVar1) {
                        std::__cxx11::wostringstream::wostringstream(local_d38);
                        pwVar7 = std::operator<<((wostream *)local_d38,"\"");
                        local_d68 = (mjs  [16])
                                    std::__cxx11::wstring::operator_cast_to_basic_string_view
                                              (local_bb0);
                        cpp_quote_abi_cxx11_(&local_d58,local_d68,local_d68._8_8_);
                        pwVar7 = std::operator<<(pwVar7,(wstring *)&local_d58);
                        std::operator<<(pwVar7,"\" may not be used as an identifier in strict mode")
                        ;
                        std::__cxx11::wstring::~wstring((wstring *)&local_d58);
                        current_extend(&local_d80,parent);
                        std::__cxx11::wostringstream::str();
                        local_d90 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                                              (local_db0);
                        message_00._M_str = in_R9;
                        message_00._M_len = local_d90._8_8_;
                        syntax_error((parser *)"parse_statement",(char *)0x3e3,(int)&local_d80,
                                     local_d90._0_8_,message_00);
                      }
                      std::__cxx11::wstring::~wstring(local_bb0);
                    }
                    expect(&local_dd8,parent,identifier,"parse_statement",0x3e6);
                    pwVar9 = token::text_abi_cxx11_(&local_dd8);
                    std::__cxx11::wstring::operator=((wstring *)&local_b40,(wstring *)pwVar9);
                    token::~token(&local_dd8);
                    pcVar10 = "parse_statement";
                    expect((token *)(local_e08 + 8),parent,rparen,"parse_statement",999);
                    token::~token((token *)(local_e08 + 8));
                    parse_block((parser *)local_e08,check_for_strict_mode);
                    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator=
                              (&finally_,
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               local_e08);
                    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::
                    ~unique_ptr((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                                local_e08);
                  }
                  accept((parser *)local_e30,iVar4,(sockaddr *)0x4a,(socklen_t *)pcVar10);
                  bVar1 = token::operator_cast_to_bool((token *)local_e30);
                  token::~token((token *)local_e30);
                  if (bVar1) {
                    parse_block((parser *)local_e38,check_for_strict_mode);
                    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator=
                              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               ((long)&catch_id.field_2 + 8),
                               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                               local_e38);
                    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::
                    ~unique_ptr((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                                local_e38);
                  }
                  make_statement<mjs::try_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::__cxx11::wstring&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                            (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                   *)parent,&catch_,
                             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                              *)&finally_,&local_b40);
                  std::__cxx11::wstring::~wstring((wstring *)&local_b40);
                  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                            ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                             ((long)&catch_id.field_2 + 8));
                  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                            (&finally_);
                  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                            (&catch_);
                }
                else {
                  accept((parser *)local_e60,iVar4,(sockaddr *)0x3f,(socklen_t *)pcVar10);
                  bVar1 = token::operator_cast_to_bool((token *)local_e60);
                  token::~token((token *)local_e60);
                  if (bVar1) {
                    e_5._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl._7_1_ = 0;
                    make_statement<mjs::debugger_statement>(this);
                    expect_semicolon_allow_insertion(parent,"parse_statement",0x3f0);
                    e_5._M_t.
                    super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                    .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl._7_1_ = 1;
                  }
                  else {
                    parse_expression((parser *)local_e70);
                    local_ea8[0xf] = 0;
                    local_f7b = false;
                    if (0 < (int)parent->version_) {
                      accept((parser *)local_e98,iVar4,(sockaddr *)0x24,
                             (socklen_t *)(ulong)parent->version_);
                      local_ea8[0xf] = 1;
                      local_f7b = token::operator_cast_to_bool((token *)local_e98);
                    }
                    if ((local_ea8[0xf] & 1) != 0) {
                      token::~token((token *)local_e98);
                    }
                    if (local_f7b == false) {
                      if ((_statement_position__LINE__._31_1_ & 1) != 0) {
                        e_00 = std::
                               unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                               operator*((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                          *)local_e70);
                        bVar1 = is_strict_mode_directive(e_00);
                        if (bVar1) {
                          parent->strict_mode_ = true;
                        }
                      }
                      expect_semicolon_allow_insertion(parent,"parse_statement",0x401);
                      make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                                (this,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                       *)parent);
                    }
                    else {
                      peVar8 = std::
                               unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                               operator->((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                           *)local_e70);
                      iVar4 = (*(peVar8->super_syntax_node)._vptr_syntax_node[3])();
                      if (iVar4 != 0) {
                        unhandled(parent,"parse_statement",0x3f7);
                      }
                      this_05 = (identifier_expression *)
                                std::
                                unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                                operator*((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                           *)local_e70);
                      pwVar9 = identifier_expression::id_abi_cxx11_(this_05);
                      parse_statement((parser *)local_ea8,check_for_strict_mode);
                      make_statement<mjs::labelled_statement,std::__cxx11::wstring_const&,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                                (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)parent,
                                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *
                                 )pwVar9);
                      std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::
                      ~unique_ptr((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>
                                   *)local_ea8);
                    }
                    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                    ~unique_ptr((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>
                                 *)local_e70);
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_001e0242;
  }
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)&cond_3);
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)&iter);
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)&local_3f8);
  pcVar10 = "parse_statement";
  expect((token *)(local_448 + 0x28),parent,lparen,"parse_statement",0x376);
  token::~token((token *)(local_448 + 0x28));
  accept((parser *)local_448,iVar4,(sockaddr *)0x34,(socklen_t *)pcVar10);
  bVar1 = token::operator_cast_to_bool((token *)local_448);
  token::~token((token *)local_448);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001dedbd:
    accept((parser *)local_550,iVar4,(sockaddr *)0x34,(socklen_t *)pcVar10);
    bVar1 = token::operator_cast_to_bool((token *)local_550);
    token::~token((token *)local_550);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      parse_expression((parser *)local_558);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                (&iter,(unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                       local_558);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_558);
      pcVar10 = "parse_statement";
      expect((token *)(local_5a8 + 0x28),parent,semicolon,"parse_statement",0x38e);
      token::~token((token *)(local_5a8 + 0x28));
    }
    accept((parser *)local_5a8,iVar4,(sockaddr *)0x2f,(socklen_t *)pcVar10);
    bVar1 = token::operator_cast_to_bool((token *)local_5a8);
    token::~token((token *)local_5a8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      parse_expression((parser *)local_5b0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                (&local_3f8,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_5b0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_5b0);
      expect((token *)(local_5e0 + 8),parent,rparen,"parse_statement",0x392);
      token::~token((token *)(local_5e0 + 8));
    }
    parse_statement((parser *)local_5e0,check_for_strict_mode);
    make_statement<mjs::for_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)parent,
               &cond_3,&iter,
               (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&local_3f8);
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_5e0);
  }
  else {
    parent->supress_in_ = true;
    accept((parser *)local_470,iVar4,(sockaddr *)0x6c,(socklen_t *)pcVar10);
    bVar1 = token::operator_cast_to_bool((token *)local_470);
    token::~token((token *)local_470);
    if (bVar1) {
      parse_variable_declaration_list(&local_490,parent);
      make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
                ((parser *)local_478,
                 (vector<mjs::declaration,_std::allocator<mjs::declaration>_> *)parent);
      std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator=
                ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&cond_3,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_478);
      std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_478);
      std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::~vector(&local_490);
    }
    else {
      parse_expression((parser *)local_4a0);
      make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)(local_4a0 + 8),
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)parent);
      std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator=
                ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&cond_3,
                 (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)(local_4a0 + 8)
                );
      std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
                ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)(local_4a0 + 8)
                );
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_4a0);
    }
    parent->supress_in_ = false;
    accept((parser *)&e,iVar4,(sockaddr *)0x52,(socklen_t *)pcVar10);
    bVar1 = token::operator_cast_to_bool((token *)&e);
    token::~token((token *)&e);
    if (!bVar1) {
      pcVar10 = "parse_statement";
      expect((token *)(local_550 + 0x28),parent,semicolon,"parse_statement",0x38a);
      token::~token((token *)(local_550 + 0x28));
      goto LAB_001dedbd;
    }
    psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&cond_3)
    ;
    iVar4 = (*(psVar5->super_syntax_node)._vptr_syntax_node[3])();
    if (iVar4 == 1) {
      this_02 = (variable_statement *)
                std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                          ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                           &cond_3);
      this_03 = variable_statement::l(this_02);
      sVar6 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::size(this_03);
      if (sVar6 != 1) {
        unhandled(parent,"parse_statement",899);
      }
    }
    parse_expression((parser *)local_4d0);
    expect((token *)(local_500 + 8),parent,rparen,"parse_statement",0x387);
    token::~token((token *)(local_500 + 8));
    parse_statement((parser *)local_500,check_for_strict_mode);
    make_statement<mjs::for_in_statement,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
              (this,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)parent,
               &cond_3,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_4d0
              );
    std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
              ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_500);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_4d0);
  }
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&local_3f8);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&iter);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
            ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)&cond_3);
LAB_001e0242:
  position_stack_node::~position_stack_node((position_stack_node *)local_40);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr parse_statement(bool check_for_strict_mode = false) {
        RECORD_STATEMENT_START;
        // Statement :
        //  Block
        //  VariableStatement
        //  EmptyStatement
        //  ExpressionStatement
        //  IfStatement
        //  IterationStatement
        //  ContinueStatement
        //  BreakStatement
        //  ReturnStatement
        //  WithStatement
        //  LabelledStatement
        //  SwitchStatement
        //  ThrowStatement
        //  TryStatement

        if (current_token_type() == token_type::lbrace) {
            return parse_block();
        } else if (accept(token_type::function_)) {
            const auto id_extend = current_extend();
            auto id = EXPECT(token_type::identifier).text();
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_statement<function_definition>(extend, id, std::move(params), std::move(block));
        } else if (accept(token_type::var_)) {
            auto dl = parse_variable_declaration_list();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<variable_statement>(std::move(dl));
        } else if (current_token_type() == token_type::semicolon) {
            get_token();
            return make_statement<empty_statement>();
        } else if (accept(token_type::if_)) {
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            auto if_s = parse_statement();
            accept(token_type::semicolon);
            auto else_s = accept(token_type::else_) ? parse_statement() : statement_ptr{};
            return make_statement<if_statement>(std::move(cond), std::move(if_s), std::move(else_s));
        } else if (/*version_ >= version::es3 && */accept(token_type::do_)) {
            auto s = parse_statement();
            EXPECT(token_type::while_);
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<do_statement>(std::move(cond), std::move(s));
        } else if (accept(token_type::while_)) {
            EXPECT(token_type::lparen);
            auto cond = parse_expression();
            EXPECT(token_type::rparen);
            return make_statement<while_statement>(std::move(cond), parse_statement());
        } else if (accept(token_type::for_)) {
            statement_ptr init{};
            expression_ptr cond{}, iter{};
            EXPECT(token_type::lparen);
            if (!accept(token_type::semicolon)) {
                // HACK: to support "NoIn" grammar :(
                supress_in_ = true;
                if (accept(token_type::var_)) {
                    init = make_statement<variable_statement>(parse_variable_declaration_list());
                } else {
                    init = make_statement<expression_statement>(parse_expression());
                }
                supress_in_ = false;
                if (accept(token_type::in_)) {
                    if (init->type() == statement_type::variable && static_cast<variable_statement&>(*init).l().size() != 1) {
                        // Only a single variable assigment is legal
                        UNHANDLED();
                    }

                    auto e = parse_expression();
                    EXPECT(token_type::rparen);
                    return make_statement<for_in_statement>(std::move(init), std::move(e), parse_statement());
                }
                EXPECT(token_type::semicolon);
            }
            if (!accept(token_type::semicolon)) {
                cond = parse_expression();
                EXPECT(token_type::semicolon);
            }
            if (!accept(token_type::rparen)) {
                iter = parse_expression();
                EXPECT(token_type::rparen);
            }
            return make_statement<for_statement>(std::move(init), std::move(cond), std::move(iter), parse_statement());
        } else if (accept(token_type::continue_)) {
            auto id = get_label();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<continue_statement>(std::move(id));
        } else if (accept(token_type::break_)) {
            auto id = get_label();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<break_statement>(std::move(id));
        } else if (accept(token_type::return_)) {
            // no line break before
            expression_ptr e{};
            if (!line_break_skipped_ && current_token_type() != token_type::semicolon) {
                e = parse_expression();
            }
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<return_statement>(std::move(e));
        } else if (current_token_type() == token_type::with_) {
            if (strict_mode_) {
                SYNTAX_ERROR("Strict mode code may not include a WithStatement");
            }
            get_token(); // Consume now that any syntax errors have been reported
            EXPECT(token_type::lparen);
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return make_statement<with_statement>(std::move(e), parse_statement());
        } else if (/*version_ >= version::es3 && */accept(token_type::switch_)) {
            EXPECT(token_type::lparen);
            auto switch_e = parse_expression();
            EXPECT(token_type::rparen);
            EXPECT(token_type::lbrace);
            clause_list cl;
            bool has_default = false;
            while (!accept(token_type::rbrace)) {
                // CaseClause
                expression_ptr e{};
                if (!accept(token_type::default_)) {
                    EXPECT(token_type::case_);
                    e = parse_expression();
                } else {
                    if (has_default) {
                        // TODO: Better error message when a switch has multiple default clauses
                        UNHANDLED();
                    }
                    has_default = true;
                }
                EXPECT(token_type::colon);
                statement_list sl;
                for (;;) {
                    const auto tt = current_token_type();
                    if (tt == token_type::rbrace
                        || tt == token_type::case_
                        || tt ==  token_type::default_
                        || tt == token_type::eof) {
                        break;
                    }
                    sl.emplace_back(parse_statement());
                }
                cl.push_back(case_clause{std::move(e), std::move(sl)});
            }
            return make_statement<switch_statement>(std::move(switch_e), std::move(cl));
        } else if (/*version_ >= version::es3 && */accept(token_type::throw_)) {
            // no line break before
            if (line_break_skipped_) {
                // TODO: Give better error message
                UNHANDLED();
            }
            auto e = parse_expression();
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<throw_statement>(std::move(e));
        } else if (/*version_ >= version::es3 && */accept(token_type::try_)) {
            auto block = parse_block();
            statement_ptr catch_{}, finally_{};
            std::wstring catch_id;
            if (accept(token_type::catch_)) {
                EXPECT(token_type::lparen);
                if (strict_mode_ && current_token_type() == token_type::identifier) {
                    auto n = current_token().text();
                    if (is_strict_mode_unassignable_identifier(n)) {
                        SYNTAX_ERROR("\"" << cpp_quote(n) << "\" may not be used as an identifier in strict mode");
                    }
                }
                catch_id = EXPECT(token_type::identifier).text();
                EXPECT(token_type::rparen);
                catch_ = parse_block();
            }
            if (accept(token_type::finally_)) {
                finally_ = parse_block();
            }
            return make_statement<try_statement>(std::move(block), std::move(catch_), catch_id, std::move(finally_));
        } else if (/*version_ >= version::es5 && */accept(token_type::debugger_)) {
            auto s = make_statement<debugger_statement>();;
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return s;
        } else {
            auto e = parse_expression();
            if (version_ >= version::es3 && accept(token_type::colon)) {
                if (e->type() != expression_type::identifier) {
                    // TODO: Better error message when encountering an invalid label (or other invalid construct)
                    UNHANDLED();
                }
                return make_statement<labelled_statement>(static_cast<const identifier_expression&>(*e).id(), parse_statement());
            }
            if (check_for_strict_mode && is_strict_mode_directive(*e)) {
                strict_mode_ = true;
#ifdef PARSER_DEBUG
                std::wcout << e->extend() << ": Strict mode enabled\n";
#endif
            }
            EXPECT_SEMICOLON_ALLOW_INSERTION();
            return make_statement<expression_statement>(std::move(e));
        }
    }